

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O0

int * compute_cells(int *dims,int *ncells)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  int *piVar19;
  int *in_RSI;
  int *in_RDI;
  int f5;
  int f4;
  int f3;
  int f2;
  int f1;
  int f0;
  int F2;
  int F1;
  int *cptr;
  int *cells;
  int k;
  int j;
  int i;
  int *local_30;
  int local_1c;
  int local_18;
  int local_14;
  
  *in_RSI = (*in_RDI + -1) * (in_RDI[1] + -1) * (in_RDI[2] + -1);
  piVar18 = (int *)malloc((long)*in_RSI * 0x18);
  iVar16 = (*in_RDI + -1) * (in_RDI[1] + -1) * in_RDI[2];
  iVar17 = (*in_RDI + -1) * in_RDI[1] * (in_RDI[2] + -1);
  local_30 = piVar18;
  for (local_1c = 0; local_1c < in_RDI[2] + -1; local_1c = local_1c + 1) {
    for (local_18 = 0; local_18 < in_RDI[1] + -1; local_18 = local_18 + 1) {
      for (local_14 = 0; local_14 < *in_RDI + -1; local_14 = local_14 + 1) {
        iVar1 = *in_RDI;
        iVar2 = in_RDI[1];
        iVar3 = *in_RDI;
        iVar4 = *in_RDI;
        iVar5 = in_RDI[1];
        iVar6 = *in_RDI;
        iVar7 = *in_RDI;
        iVar8 = in_RDI[1];
        iVar9 = *in_RDI;
        iVar10 = *in_RDI;
        iVar11 = in_RDI[1];
        iVar12 = *in_RDI;
        iVar13 = *in_RDI;
        iVar14 = in_RDI[1];
        iVar15 = *in_RDI;
        *local_30 = iVar16 + local_1c * (*in_RDI + -1) * in_RDI[1] + local_18 * (*in_RDI + -1) +
                    local_14;
        local_30[1] = iVar16 + local_1c * (iVar1 + -1) * iVar2 + (local_18 + 1) * (iVar3 + -1) +
                      local_14;
        local_30[2] = iVar16 + iVar17 + local_1c * iVar13 * (iVar14 + -1) + local_18 * iVar15 +
                      local_14 + 1;
        local_30[3] = iVar16 + iVar17 + local_1c * iVar10 * (iVar11 + -1) + local_18 * iVar12 +
                      local_14;
        piVar19 = local_30 + 5;
        local_30[4] = (local_1c + 1) * (iVar4 + -1) * (iVar5 + -1) + local_18 * (iVar6 + -1) +
                      local_14;
        local_30 = local_30 + 6;
        *piVar19 = local_1c * (iVar7 + -1) * (iVar8 + -1) + local_18 * (iVar9 + -1) + local_14;
      }
    }
  }
  return piVar18;
}

Assistant:

int *
compute_cells(const int *dims, int *ncells) {
  int i,j,k;
  *ncells = (dims[0]-1)*(dims[1]-1)*(dims[2]-1);
  int *cells = (int *)malloc(*ncells * sizeof(int)*6);
  int *cptr = cells;

  int F1 = (dims[0]-1)*(dims[1]-1)*dims[2];     /* back/front */
  int F2 = (dims[0]-1)*(dims[1])  *(dims[2]-1); /* bottom/top */
  // int F3 = (dims[0])  *(dims[1]-1)*(dims[2]-1); /* left/right */

  for(k = 0; k < dims[2]-1; k++)
    for(j = 0; j < dims[1]-1; j++)
      for(i = 0; i < dims[0]-1; i++) {
        int f0 = F1 + k*(dims[0]-1)*dims[1] + j*(dims[0]-1) + i;     /* bottom */
        int f1 = F1 + k*(dims[0]-1)*dims[1] + (j+1)*(dims[0]-1) + i; /* top */
        int f2 = (k+1)*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;  /* front */
        int f3 = k*(dims[0]-1)*(dims[1]-1) + j*(dims[0]-1) + i;      /* back  */
        int f4 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i;      /* left */
        int f5 = F1+F2 + k*dims[0]*(dims[1]-1) + j*dims[0] + i+1;    /* right */

        /* This ordering works (see fms.h) */
        *cptr++ = f0;
        *cptr++ = f1;
        *cptr++ = f5;
        *cptr++ = f4;
        *cptr++ = f2;
        *cptr++ = f3;
      }
#ifdef DEBUG_PRINT
  for(i = 0; i < *ncells; i++)
    printf("cell %d: %d %d %d %d %d %d\n", i,
           cells[6*i+0],
           cells[6*i+1],
           cells[6*i+2],
           cells[6*i+3],
           cells[6*i+4],
           cells[6*i+5]
          );
#endif

  return cells;
}